

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclDnsize.c
# Opt level: O2

void Abc_SclFindWindow(Abc_Obj_t *pPivot,Vec_Int_t **pvNodes,Vec_Int_t **pvEvals)

{
  Abc_Ntk_t *pNtk;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  void *pvVar1;
  long *plVar2;
  long lVar3;
  int *piVar4;
  int iVar5;
  Abc_Obj_t *pAVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  size_t __nmemb;
  char *__assertion;
  long lVar11;
  long lVar12;
  
  if ((*(uint *)&pPivot->field_0x14 & 0xf) == 7) {
    pNtk = pPivot->pNtk;
    p = *pvNodes;
    p_00 = *pvEvals;
    p->nSize = 0;
    for (lVar11 = 0; lVar11 < (pPivot->vFanins).nSize; lVar11 = lVar11 + 1) {
      pvVar1 = pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar11]];
      uVar7 = *(uint *)((long)pvVar1 + 0x14) & 0xf;
      if (((uVar7 == 2) || (uVar7 == 5)) || (0 < *(int *)((long)pvVar1 + 0x1c))) {
        Vec_IntPush(p,*(int *)((long)pvVar1 + 0x10));
      }
    }
    Vec_IntPush(p,pPivot->Id);
    for (lVar11 = 0; lVar11 < (pPivot->vFanouts).nSize; lVar11 = lVar11 + 1) {
      plVar2 = (long *)pPivot->pNtk->vObjs->pArray[(pPivot->vFanouts).pArray[lVar11]];
      if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 7) {
        Vec_IntPush(p,(int)plVar2[2]);
        for (lVar12 = 0; lVar12 < *(int *)((long)plVar2 + 0x2c); lVar12 = lVar12 + 1) {
          lVar3 = *(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                           (long)*(int *)(plVar2[6] + lVar12 * 4) * 8);
          if ((*(uint *)(lVar3 + 0x14) & 0xf) == 7) {
            Vec_IntPush(p,*(int *)(lVar3 + 0x10));
          }
        }
      }
    }
    __nmemb = (size_t)p->nSize;
    if (1 < (long)__nmemb) {
      qsort(p->pArray,__nmemb,4,Vec_IntSortCompare1);
      __nmemb = 1;
      for (lVar11 = 1; iVar10 = (int)__nmemb, lVar11 < p->nSize; lVar11 = lVar11 + 1) {
        piVar4 = p->pArray;
        if (piVar4[lVar11] != piVar4[lVar11 + -1]) {
          __nmemb = (size_t)(iVar10 + 1);
          piVar4[iVar10] = piVar4[lVar11];
        }
      }
      p->nSize = iVar10;
    }
    for (iVar10 = 0; iVar10 < (int)__nmemb; iVar10 = iVar10 + 1) {
      iVar5 = Vec_IntEntry(p,iVar10);
      pAVar6 = Abc_NtkObj(pNtk,iVar5);
      if (pAVar6 != (Abc_Obj_t *)0x0) {
        if ((*(uint *)&pAVar6->field_0x14 & 0x20) != 0) {
          __assertion = "pObj->fMarkB == 0";
          uVar7 = 0x48;
          goto LAB_003b346c;
        }
        *(uint *)&pAVar6->field_0x14 = *(uint *)&pAVar6->field_0x14 | 0x20;
      }
      __nmemb = (size_t)(uint)p->nSize;
    }
    p_00->nSize = 0;
    for (iVar10 = 0; iVar5 = p->nSize, iVar10 < iVar5; iVar10 = iVar10 + 1) {
      iVar5 = Vec_IntEntry(p,iVar10);
      pAVar6 = Abc_NtkObj(pNtk,iVar5);
      if (pAVar6 != (Abc_Obj_t *)0x0) {
        uVar7 = (pAVar6->vFanouts).nSize;
        uVar8 = (ulong)uVar7;
        if ((int)uVar7 < 1) {
          uVar8 = 0;
        }
        uVar9 = 0;
        do {
          if (uVar8 == uVar9) goto LAB_003b33f3;
          piVar4 = (pAVar6->vFanouts).pArray + uVar9;
          uVar9 = uVar9 + 1;
        } while ((*(byte *)((long)pAVar6->pNtk->vObjs->pArray[*piVar4] + 0x14) & 0x20) != 0);
        if ((pAVar6->field_0x14 & 0x20) == 0) {
          __assertion = "pObj->fMarkB";
          uVar7 = 0x51;
          goto LAB_003b346c;
        }
        Vec_IntPush(p_00,pAVar6->Id);
      }
LAB_003b33f3:
    }
    if (0 < p_00->nSize) {
      for (iVar10 = 0; iVar10 < iVar5; iVar10 = iVar10 + 1) {
        iVar5 = Vec_IntEntry(p,iVar10);
        pAVar6 = Abc_NtkObj(pNtk,iVar5);
        if (pAVar6 != (Abc_Obj_t *)0x0) {
          pAVar6->field_0x14 = pAVar6->field_0x14 & 0xdf;
        }
        iVar5 = p->nSize;
      }
      return;
    }
    __assertion = "Vec_IntSize(vEvals) > 0";
    uVar7 = 0x55;
  }
  else {
    __assertion = "Abc_ObjIsNode(pPivot)";
    uVar7 = 0x34;
  }
LAB_003b346c:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclDnsize.c"
                ,uVar7,"void Abc_SclFindWindow(Abc_Obj_t *, Vec_Int_t **, Vec_Int_t **)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Find the array of nodes to be updated.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_SclFindWindow( Abc_Obj_t * pPivot, Vec_Int_t ** pvNodes, Vec_Int_t ** pvEvals )
{
    Abc_Ntk_t * p = Abc_ObjNtk(pPivot);
    Abc_Obj_t * pObj, * pNext, * pNext2;
    Vec_Int_t * vNodes = *pvNodes;
    Vec_Int_t * vEvals = *pvEvals;
    int i, k;
    assert( Abc_ObjIsNode(pPivot) );
    // collect fanins, node, and fanouts
    Vec_IntClear( vNodes );
    Abc_ObjForEachFanin( pPivot, pNext, i )
//        if ( Abc_ObjIsNode(pNext) && Abc_ObjFaninNum(pNext) > 0 )
        if ( Abc_ObjIsCi(pNext) || Abc_ObjFaninNum(pNext) > 0 )
            Vec_IntPush( vNodes, Abc_ObjId(pNext) );
    Vec_IntPush( vNodes, Abc_ObjId(pPivot) );
    Abc_ObjForEachFanout( pPivot, pNext, i )
        if ( Abc_ObjIsNode(pNext) )
        {
            Vec_IntPush( vNodes, Abc_ObjId(pNext) );
            Abc_ObjForEachFanout( pNext, pNext2, k )
                if ( Abc_ObjIsNode(pNext2) )
                    Vec_IntPush( vNodes, Abc_ObjId(pNext2) );
        }
    Vec_IntUniqify( vNodes );
    // label nodes
    Abc_NtkForEachObjVec( vNodes, p, pObj, i )
    {
        assert( pObj->fMarkB == 0 );
        pObj->fMarkB = 1;
    }
    // collect nodes visible from the critical paths
    Vec_IntClear( vEvals );
    Abc_NtkForEachObjVec( vNodes, p, pObj, i )
        Abc_ObjForEachFanout( pObj, pNext, k )
            if ( !pNext->fMarkB )
            {
                assert( pObj->fMarkB );
                Vec_IntPush( vEvals, Abc_ObjId(pObj) );
                break;
            }
    assert( Vec_IntSize(vEvals) > 0 );
    // label nodes
    Abc_NtkForEachObjVec( vNodes, p, pObj, i )
        pObj->fMarkB = 0;
}